

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_3dfloors.cpp
# Opt level: O3

void R_3D_EnterSkybox(void)

{
  int iVar1;
  HeightLevel *pHVar2;
  HeightLevel *pHVar3;
  HeightStack *pHVar4;
  ulong uVar5;
  
  pHVar3 = height_cur;
  pHVar2 = height_top;
  iVar1 = height_max;
  TArray<HeightStack,_HeightStack>::Grow(&toplist,1);
  pHVar4 = toplist.Array;
  uVar5 = (ulong)toplist.Count;
  toplist.Array[uVar5].height_top = pHVar2;
  pHVar4[uVar5].height_cur = pHVar3;
  pHVar4[uVar5].height_max = iVar1;
  toplist.Count = toplist.Count + 1;
  height_top = (HeightLevel *)0x0;
  height_cur = (HeightLevel *)0x0;
  height_max = -1;
  CurrentSkybox = CurrentSkybox + 1;
  return;
}

Assistant:

void R_3D_EnterSkybox()
{
	HeightStack current;

	current.height_top = height_top;
	current.height_cur = height_cur;
	current.height_max = height_max;

	toplist.Push(current);

	height_top = NULL;
	height_cur = NULL;
	height_max = -1;

	CurrentSkybox++;
}